

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpointer.hpp
# Opt level: O1

void __thiscall
jsoncons::jsonpointer::
remove<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
          (jsonpointer *this,basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *root,
          basic_json_pointer<char> *location,error_code *ec)

{
  long lVar1;
  size_t sVar2;
  bool bVar3;
  char *pcVar4;
  jsonpointer_errc __e;
  long lVar5;
  type tVar6;
  array_range_type aVar7;
  size_t index;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> buffer;
  string_view_type local_60;
  detail *local_50;
  char *local_48;
  detail local_40 [16];
  
  local_50 = local_40;
  local_48 = (char *)0x0;
  local_40[0] = (detail)0x0;
  lVar5 = *(long *)&root->field_0;
  lVar1 = (root->field_0).int64_.val_;
  if (lVar5 != lVar1) {
    do {
      std::__cxx11::string::_M_assign((string *)&local_50);
      lVar5 = lVar5 + 0x20;
      if (lVar5 != lVar1) {
        local_60._M_len = (size_t)local_48;
        local_60._M_str = (char *)local_50;
        ec = (error_code *)location;
        this = (jsonpointer *)
               detail::
               resolve<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                         ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,
                          &local_60,false,(error_code *)location);
        if (*(int *)&(location->tokens_).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start != 0) goto LAB_003abe29;
      }
    } while (lVar5 != lVar1);
  }
  bVar3 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_array
                    ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this);
  if (bVar3) {
    if ((local_48 == (char *)0x1) && (*local_50 == (detail)0x2d)) {
      __e = index_exceeds_array_size;
    }
    else {
      local_60._M_len = 0;
      tVar6 = jsoncons::detail::dec_to_integer<unsigned_long,char>
                        (local_50,local_48,(size_t)&local_60,(unsigned_long *)ec);
      sVar2 = local_60._M_len;
      __e = invalid_index;
      if (tVar6.ec == success) {
        pcVar4 = (char *)basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size
                                   ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>
                                     *)this);
        __e = index_exceeds_array_size;
        if (sVar2 < pcVar4) {
          aVar7 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::array_range
                            ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                             this);
          basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::erase
                    ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,
                     aVar7.first_._M_current._M_current + local_60._M_len);
          goto LAB_003abe29;
        }
      }
    }
  }
  else {
    bVar3 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_object
                      ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this);
    if (bVar3) {
      local_60._M_len = (size_t)local_48;
      local_60._M_str = (char *)local_50;
      bVar3 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::contains
                        ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,
                         &local_60);
      if (bVar3) {
        local_60._M_len = (size_t)local_48;
        local_60._M_str = (char *)local_50;
        basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::erase
                  ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,
                   &local_60);
        goto LAB_003abe29;
      }
      __e = key_not_found;
    }
    else {
      __e = expected_object_or_array;
    }
  }
  std::error_code::operator=((error_code *)location,__e);
LAB_003abe29:
  remove<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
            ((jsonpointer *)&local_50,(char *)local_40);
  return;
}

Assistant:

void remove(Json& root, const basic_json_pointer<typename Json::char_type>& location, std::error_code& ec)
    {
        Json* current = std::addressof(root);

        std::basic_string<typename Json::char_type> buffer;
        auto it = location.begin();
        auto end = location.end();

        while (it != end)
        {
            buffer = *it;
            ++it;
            if (it != end)
            {
                current = jsoncons::jsonpointer::detail::resolve(current, buffer, false, ec);
                if (JSONCONS_UNLIKELY(ec))
                    return;
            }
        }
        if (current->is_array())
        {
            if (buffer.size() == 1 && buffer[0] == '-')
            {
                ec = jsonpointer_errc::index_exceeds_array_size;
                return;
            }
            else
            {
                std::size_t index{0};
                auto result = jsoncons::detail::dec_to_integer(buffer.data(), buffer.length(), index);
                if (!result)
                {
                    ec = jsonpointer_errc::invalid_index;
                    return;
                }
                if (index >= current->size())
                {
                    ec = jsonpointer_errc::index_exceeds_array_size;
                    return;
                }
                current->erase(current->array_range().begin()+index);
            }
        }
        else if (current->is_object())
        {
            if (!current->contains(buffer))
            {
                ec = jsonpointer_errc::key_not_found;
                return;
            }
            else
            {
                current->erase(buffer);
            }
        }
        else
        {
            ec = jsonpointer_errc::expected_object_or_array;
            return;
        }
    }